

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall
chatra::RuntimeImp::restoreNode(RuntimeImp *this,Reader *r,PackageId packageId,Node *node)

{
  mapped_type *ppPVar1;
  undefined8 *puVar2;
  PackageId local_90 [5];
  undefined **local_68;
  IErrorReceiverBridge errorReceiverBridge;
  shared_ptr<chatra::Node> n;
  
  if ((node->blockNodesState)._M_i != Parsed) {
    errorReceiverBridge.super_IErrorReceiver._vptr_IErrorReceiver =
         (_func_int **)&this->super_IErrorReceiver;
    local_68 = &PTR__IErrorReceiver_00245f18;
    errorReceiverBridge.target._0_4_ = 0;
    local_90[0] = packageId;
    ppPVar1 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_chatra::Package_*>,_std::allocator<std::pair<const_unsigned_long,_chatra::Package_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_chatra::Package_*>,_std::allocator<std::pair<const_unsigned_long,_chatra::Package_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&(this->packageIds).values,local_90);
    Package::parseNode((Package *)&errorReceiverBridge.errorCount,(IErrorReceiver *)*ppPVar1,
                       (Node *)&local_68,SUB81(node,0));
    errorReceiverBridge.errorCount = 0;
    errorReceiverBridge._20_4_ = 0;
    if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if ((int)errorReceiverBridge.target != 0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &PTR__exception_002461d8;
      __cxa_throw(puVar2,&AbortCompilingException::typeinfo,std::exception::~exception);
    }
    restoreEntities(this,r,packageId,node);
  }
  return;
}

Assistant:

void RuntimeImp::restoreNode(Reader& r, PackageId packageId, Node* node) {
	if (node->blockNodesState == NodeState::Parsed)
		return;

	IErrorReceiverBridge errorReceiverBridge(*this);
	try {
		auto n = packageIds.ref(packageId)->parseNode(errorReceiverBridge, node);
		n.reset();
		if (errorReceiverBridge.hasError())
			throw AbortCompilingException();
	}
	catch (AbortCompilingException&) {
		errorAtNode(*this, ErrorLevel::Error, node, "an unrecoverable parser error encountered during restoration", {});
		throw IllegalArgumentException();
	}

	restoreEntities(r, packageId, node);
}